

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O0

uint __thiscall glsl_type::std140_base_alignment(glsl_type *this,bool row_major)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  glsl_type *pgVar7;
  uint local_6c;
  bool local_61;
  uint local_60;
  glsl_type *field_type;
  glsl_matrix_layout matrix_layout;
  uint uStack_3c;
  bool field_row_major;
  uint i;
  uint base_alignment;
  int r;
  int c;
  glsl_type *array_type;
  glsl_type *vec_type;
  uint N;
  bool row_major_local;
  glsl_type *this_local;
  
  bVar3 = is_64bit(this);
  uVar6 = 4;
  if (bVar3) {
    uVar6 = 8;
  }
  bVar3 = is_scalar(this);
  if ((bVar3) || (bVar3 = is_vector(this), bVar3)) {
    uVar5 = (uint)this->vector_elements;
    if (uVar5 == 1) {
      return uVar6;
    }
    if (uVar5 == 2) {
      return uVar6 << 1;
    }
    if (uVar5 - 3 < 2) {
      return uVar6 << 2;
    }
  }
  bVar3 = is_array(this);
  if (bVar3) {
    bVar3 = is_scalar((this->fields).array);
    if (((bVar3) || (bVar3 = is_vector((this->fields).array), bVar3)) ||
       (bVar3 = is_matrix((this->fields).array), bVar3)) {
      uVar6 = std140_base_alignment((this->fields).array,row_major);
      if (uVar6 < 0x11) {
        local_60 = 0x10;
      }
      else {
        local_60 = std140_base_alignment((this->fields).array,row_major);
      }
      this_local._4_4_ = local_60;
    }
    else {
      bVar3 = is_struct((this->fields).array);
      local_61 = true;
      if (!bVar3) {
        local_61 = is_array((this->fields).array);
      }
      if (local_61 == false) {
        __assert_fail("this->fields.array->is_struct() || this->fields.array->is_array()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                      ,0x6ce,"unsigned int glsl_type::std140_base_alignment(bool) const");
      }
      this_local._4_4_ = std140_base_alignment((this->fields).array,row_major);
    }
  }
  else {
    bVar3 = is_matrix(this);
    if (bVar3) {
      bVar1 = this->matrix_columns;
      bVar2 = this->vector_elements;
      if (row_major) {
        pgVar7 = get_instance(*(uint *)&this->field_0x4 & 0xff,(uint)bVar1,1,0,false);
        _r = get_array_instance(pgVar7,(uint)bVar2,0);
      }
      else {
        pgVar7 = get_instance(*(uint *)&this->field_0x4 & 0xff,(uint)bVar2,1,0,false);
        _r = get_array_instance(pgVar7,(uint)bVar1,0);
      }
      this_local._4_4_ = std140_base_alignment(_r,false);
    }
    else {
      bVar3 = is_struct(this);
      if (!bVar3) {
        __assert_fail("!\"not reached\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                      ,0x70b,"unsigned int glsl_type::std140_base_alignment(bool) const");
      }
      uStack_3c = 0x10;
      for (matrix_layout = GLSL_MATRIX_LAYOUT_INHERITED; matrix_layout < this->length;
          matrix_layout = matrix_layout + GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
        uVar4 = *(ushort *)&(this->fields).array[matrix_layout].fields >> 5 & 3;
        if (uVar4 == 2) {
          field_type._7_1_ = true;
        }
        else {
          field_type._7_1_ = row_major;
          if (uVar4 == 1) {
            field_type._7_1_ = false;
          }
        }
        pgVar7 = *(glsl_type **)((this->fields).array + matrix_layout);
        uVar6 = std140_base_alignment(pgVar7,field_type._7_1_);
        if (uVar6 < uStack_3c) {
          local_6c = uStack_3c;
        }
        else {
          local_6c = std140_base_alignment(pgVar7,field_type._7_1_);
        }
        uStack_3c = local_6c;
      }
      this_local._4_4_ = uStack_3c;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned
glsl_type::std140_base_alignment(bool row_major) const
{
   unsigned N = is_64bit() ? 8 : 4;

   /* (1) If the member is a scalar consuming <N> basic machine units, the
    *     base alignment is <N>.
    *
    * (2) If the member is a two- or four-component vector with components
    *     consuming <N> basic machine units, the base alignment is 2<N> or
    *     4<N>, respectively.
    *
    * (3) If the member is a three-component vector with components consuming
    *     <N> basic machine units, the base alignment is 4<N>.
    */
   if (this->is_scalar() || this->is_vector()) {
      switch (this->vector_elements) {
      case 1:
         return N;
      case 2:
         return 2 * N;
      case 3:
      case 4:
         return 4 * N;
      }
   }

   /* (4) If the member is an array of scalars or vectors, the base alignment
    *     and array stride are set to match the base alignment of a single
    *     array element, according to rules (1), (2), and (3), and rounded up
    *     to the base alignment of a vec4. The array may have padding at the
    *     end; the base offset of the member following the array is rounded up
    *     to the next multiple of the base alignment.
    *
    * (6) If the member is an array of <S> column-major matrices with <C>
    *     columns and <R> rows, the matrix is stored identically to a row of
    *     <S>*<C> column vectors with <R> components each, according to rule
    *     (4).
    *
    * (8) If the member is an array of <S> row-major matrices with <C> columns
    *     and <R> rows, the matrix is stored identically to a row of <S>*<R>
    *     row vectors with <C> components each, according to rule (4).
    *
    * (10) If the member is an array of <S> structures, the <S> elements of
    *      the array are laid out in order, according to rule (9).
    */
   if (this->is_array()) {
      if (this->fields.array->is_scalar() ||
          this->fields.array->is_vector() ||
          this->fields.array->is_matrix()) {
         return MAX2(this->fields.array->std140_base_alignment(row_major), 16);
      } else {
         assert(this->fields.array->is_struct() ||
                this->fields.array->is_array());
         return this->fields.array->std140_base_alignment(row_major);
      }
   }

   /* (5) If the member is a column-major matrix with <C> columns and
    *     <R> rows, the matrix is stored identically to an array of
    *     <C> column vectors with <R> components each, according to
    *     rule (4).
    *
    * (7) If the member is a row-major matrix with <C> columns and <R>
    *     rows, the matrix is stored identically to an array of <R>
    *     row vectors with <C> components each, according to rule (4).
    */
   if (this->is_matrix()) {
      const struct glsl_type *vec_type, *array_type;
      int c = this->matrix_columns;
      int r = this->vector_elements;

      if (row_major) {
         vec_type = get_instance(base_type, c, 1);
         array_type = glsl_type::get_array_instance(vec_type, r);
      } else {
         vec_type = get_instance(base_type, r, 1);
         array_type = glsl_type::get_array_instance(vec_type, c);
      }

      return array_type->std140_base_alignment(false);
   }

   /* (9) If the member is a structure, the base alignment of the
    *     structure is <N>, where <N> is the largest base alignment
    *     value of any of its members, and rounded up to the base
    *     alignment of a vec4. The individual members of this
    *     sub-structure are then assigned offsets by applying this set
    *     of rules recursively, where the base offset of the first
    *     member of the sub-structure is equal to the aligned offset
    *     of the structure. The structure may have padding at the end;
    *     the base offset of the member following the sub-structure is
    *     rounded up to the next multiple of the base alignment of the
    *     structure.
    */
   if (this->is_struct()) {
      unsigned base_alignment = 16;
      for (unsigned i = 0; i < this->length; i++) {
         bool field_row_major = row_major;
         const enum glsl_matrix_layout matrix_layout =
            glsl_matrix_layout(this->fields.structure[i].matrix_layout);
         if (matrix_layout == GLSL_MATRIX_LAYOUT_ROW_MAJOR) {
            field_row_major = true;
         } else if (matrix_layout == GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
            field_row_major = false;
         }

         const struct glsl_type *field_type = this->fields.structure[i].type;
         base_alignment = MAX2(base_alignment,
                               field_type->std140_base_alignment(field_row_major));
      }
      return base_alignment;
   }

   assert(!"not reached");
   return -1;
}